

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall
SQVM::Set(SQVM *this,SQObjectPtr *self,SQObjectPtr *key,SQObjectPtr *val,SQInteger selfidx)

{
  SQObjectType SVar1;
  bool bVar2;
  SQChar *pSVar3;
  SQChar *pSVar4;
  SQInteger SVar5;
  SQInteger local_60;
  SQInteger selfidx_local;
  SQObjectPtr *val_local;
  SQObjectPtr *key_local;
  SQObjectPtr *self_local;
  SQVM *this_local;
  
  SVar1 = (self->super_SQObject)._type;
  if (SVar1 == OT_ARRAY) {
    if (((key->super_SQObject)._type & 0x4000000) == 0) {
      pSVar4 = GetTypeName(self);
      pSVar3 = GetTypeName(key);
      Raise_Error(this,"indexing %s with %s",pSVar4,pSVar3);
      return false;
    }
    if ((key->super_SQObject)._type == OT_FLOAT) {
      local_60 = (SQInteger)(key->super_SQObject)._unVal.fFloat;
    }
    else {
      local_60 = (key->super_SQObject)._unVal.nInteger;
    }
    bVar2 = SQArray::Set((self->super_SQObject)._unVal.pArray,local_60,val);
    if (!bVar2) {
      Raise_IdxError(this,key);
      return false;
    }
    return true;
  }
  if (SVar1 == OT_TABLE) {
    bVar2 = SQTable::Set((self->super_SQObject)._unVal.pTable,key,val);
    if (bVar2) {
      return true;
    }
  }
  else if (SVar1 != OT_USERDATA) {
    if (SVar1 != OT_INSTANCE) {
      pSVar4 = GetTypeName(self);
      Raise_Error(this,"trying to set \'%s\'",pSVar4);
      return false;
    }
    bVar2 = SQInstance::Set((self->super_SQObject)._unVal.pInstance,key,val);
    if (bVar2) {
      return true;
    }
  }
  SVar5 = FallBackSet(this,self,key,val);
  if (SVar5 == 0) {
    this_local._7_1_ = true;
  }
  else if ((SVar5 == 1) || (SVar5 != 2)) {
    if ((selfidx == 0) &&
       (bVar2 = SQTable::Set((this->_roottable).super_SQObject._unVal.pTable,key,val), bVar2)) {
      this_local._7_1_ = true;
    }
    else {
      Raise_IdxError(this,key);
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SQVM::Set(const SQObjectPtr &self,const SQObjectPtr &key,const SQObjectPtr &val,SQInteger selfidx)
{
    switch(type(self)){
    case OT_TABLE:
        if(_table(self)->Set(key,val)) return true;
        break;
    case OT_INSTANCE:
        if(_instance(self)->Set(key,val)) return true;
        break;
    case OT_ARRAY:
        if(!sq_isnumeric(key)) { Raise_Error(_SC("indexing %s with %s"),GetTypeName(self),GetTypeName(key)); return false; }
        if(!_array(self)->Set(tointeger(key),val)) {
            Raise_IdxError(key);
            return false;
        }
        return true;
	case OT_USERDATA: break; // must fall back
    default:
        Raise_Error(_SC("trying to set '%s'"),GetTypeName(self));
        return false;
    }

    switch(FallBackSet(self,key,val)) {
        case FALLBACK_OK: return true; //okie
        case FALLBACK_NO_MATCH: break; //keep falling back
        case FALLBACK_ERROR: return false; // the metamethod failed
    }
    if(selfidx == 0) {
        if(_table(_roottable)->Set(key,val))
            return true;
    }
    Raise_IdxError(key);
    return false;
}